

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Head_base<0UL,_double_*,_false> _Var5;
  _Head_base<0UL,_int_*,_false> _Var6;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
  _Var10;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
  _Var11;
  row_value rVar12;
  undefined8 extraout_RAX;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  _Head_base<0UL,_int_*,_false> _Var18;
  long lVar19;
  int *piVar20;
  type it;
  rc_data *__last;
  long lVar21;
  long lVar22;
  rc_data *ret;
  ulong uVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 in_XMM4_Qb;
  undefined1 local_98 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_88;
  long local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_78;
  solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
  *local_70;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_68;
  double local_60;
  int *local_58;
  int *local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current != last._M_current) {
    local_70 = this + 8;
    dVar25 = kappa / (1.0 - kappa);
    local_78._M_head_impl = (row_value *)this;
    local_60 = theta;
    local_58 = last._M_current;
    do {
      _Var18._M_head_impl = (int *)(long)*first._M_current;
      if (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
            *)this)->m <= *first._M_current) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        goto LAB_00178ef2;
      }
      local_50 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_98,(int)local_70);
      uVar15 = 0;
      local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)_Var18._M_head_impl;
      if (local_98._8_8_ != local_98._0_8_) {
        _Var5._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                *)this)->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
        _Var18._M_head_impl = (int *)local_98._8_8_;
        do {
          iVar17 = *_Var18._M_head_impl;
          _Var18._M_head_impl = _Var18._M_head_impl + 8;
          _Var5._M_head_impl[iVar17] = local_60 * _Var5._M_head_impl[iVar17];
        } while (_Var18._M_head_impl != (int *)local_98._0_8_);
        uVar15 = 0;
        if (local_98._8_8_ != local_98._0_8_) {
          uVar9 = 1;
          uVar15 = 0;
          _Var18._M_head_impl = (int *)local_98._8_8_;
          do {
            uVar14 = uVar15;
            uVar23 = (ulong)uVar9;
            sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)local_70);
            _Var6._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl
                == (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              dVar26 = 0.0;
            }
            else {
              auVar27 = ZEXT816(0);
              do {
                iVar17 = *local_38._M_head_impl;
                local_38._M_head_impl = local_38._M_head_impl + 2;
                auVar33._0_8_ = (double)_Var6._M_head_impl[iVar17];
                auVar33._8_8_ = in_XMM4_Qb;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                                  *)this)->P)._M_t.
                               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                               super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar17];
                auVar27 = vfmadd231sd_fma(auVar27,auVar33,auVar2);
                dVar26 = auVar27._0_8_;
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_38._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
            }
            _Var10._M_head_impl =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
                 ._M_head_impl;
            _Var10._M_head_impl[uVar14].id = (int)uVar14;
            iVar17 = *_Var18._M_head_impl;
            _Var18._M_head_impl = _Var18._M_head_impl + 2;
            _Var10._M_head_impl[uVar14].a = _Var6._M_head_impl[iVar17];
            uVar9 = uVar9 + 1;
            _Var10._M_head_impl[uVar14].value =
                 (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->c->linear_elements)._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl[*(int *)(local_98._8_8_ + 4)] -
                 dVar26;
            uVar15 = uVar14 + 1;
          } while (_Var18._M_head_impl != (int *)local_98._0_8_);
          if (uVar14 != 0) {
            __g = ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var10._M_head_impl,_Var10._M_head_impl + (uVar15 & 0xffffffff),
                       (int)LZCOUNT(uVar15 & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var10._M_head_impl,_Var10._M_head_impl + (uVar15 & 0xffffffff));
            __last = _Var10._M_head_impl + 1;
            lVar19 = uVar23 * 0x10 + -0x10;
            do {
              if (((_Var10._M_head_impl)->value != __last->value) ||
                 (NAN((_Var10._M_head_impl)->value) || NAN(__last->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var10._M_head_impl,__last,__g);
                _Var10._M_head_impl = __last;
              }
              __last = __last + 1;
              lVar19 = lVar19 + -0x10;
            } while (lVar19 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var10._M_head_impl,__last,__g);
          }
        }
      }
      _Var11._M_head_impl =
           (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::bound_factor_*,_false>
           ._M_head_impl;
      local_68._M_head_impl =
           (col_value *)
           ((long)local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl * 3);
      iVar17 = (int)uVar15;
      if (_Var11._M_head_impl
          [(long)local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl].min < 1) {
        lVar19 = 0xffffffff;
        iVar16 = 0;
LAB_00178cf7:
        uVar9 = (uint)lVar19;
        iVar13 = uVar9 + 1;
        if ((iVar13 < iVar17) &&
           (iVar16 <= (&(_Var11._M_head_impl)->max)[(long)local_68._M_head_impl])) {
          local_80 = (long)iVar17;
          rVar12 = *(row_value *)((long)this + 0x50);
          lVar24 = (long)(int)uVar9 << 4;
          lVar22 = (long)(int)uVar9 + 1;
          do {
            lVar19 = lVar22;
            iVar16 = iVar16 + *(int *)((long)rVar12 + 0x1c + lVar24);
            if (iVar16 < *(int *)((long)*(row_value *)((long)this + 0x58) +
                                 (long)local_68._M_head_impl * 4)) {
              piVar20 = (int *)(local_98._8_8_ +
                               (long)*(int *)((long)rVar12 + 0x18 + lVar24) * 2 * 4);
LAB_00178dee:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar20[1]);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dVar25;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = delta;
              auVar30._8_8_ = 0;
              auVar30._0_8_ =
                   *(double *)((long)*(row_value *)((long)this + 0x50) + 0x10 + lVar24) * 0.5;
              auVar27 = vfmadd213sd_fma(auVar30,auVar36,auVar4);
              *(double *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar20 * 8) =
                   *(double *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar20 * 8) -
                   auVar27._0_8_;
              break;
            }
            piVar20 = (int *)(local_98._8_8_ + (long)*(int *)((long)rVar12 + 0x18 + lVar24) * 2 * 4)
            ;
            if (*(int *)((long)*(row_value *)((long)this + 0x58) + (long)local_68._M_head_impl * 4 +
                        4) < iVar16) goto LAB_00178dee;
            dVar26 = *(double *)((long)rVar12 + 0x10 + lVar24);
            dVar32 = 0.0;
            if ((dVar26 == 0.0) && (!NAN(dVar26))) {
              dVar26 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)*(row_value *)this);
              dVar32 = 0.5;
            }
            if (dVar32 <= dVar26) goto LAB_00178dee;
            bit_array_impl::set(&x->super_bit_array_impl,piVar20[1]);
            rVar12 = *(row_value *)((long)this + 0x50);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = dVar25;
            pdVar1 = (double *)((long)rVar12 + 0x10 + lVar24);
            lVar24 = lVar24 + 0x10;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = delta;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *pdVar1 * 0.5;
            auVar27 = vfmadd213sd_fma(auVar29,auVar35,auVar3);
            *(double *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar20 * 8) =
                 auVar27._0_8_ +
                 *(double *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar20 * 8);
            lVar22 = lVar19 + 1;
          } while (lVar19 + 1 < local_80);
          goto LAB_00178e33;
        }
      }
      else {
        _Var10._M_head_impl =
             (((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar24 = 0;
        iVar16 = 0;
        local_48 = (long)iVar17 + -2;
        lVar22 = -1;
        do {
          uVar7 = local_98._8_8_;
          lVar21 = (long)*(int *)((long)&(_Var10._M_head_impl)->id + lVar24);
          iVar16 = iVar16 + *(int *)((long)&(_Var10._M_head_impl)->a + lVar24);
          lVar19 = lVar22 + 1;
          local_80 = CONCAT44(local_80._4_4_,
                              *(undefined4 *)
                               ((long)*(row_value *)((long)this + 0x58) +
                               (long)local_68._M_head_impl * 4));
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_98._8_8_ + (lVar21 * 2 + 1) * 4));
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar25;
          _Var10._M_head_impl = *(rc_data **)((long)local_78._M_head_impl + 0x50);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = delta;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(double *)((long)&(_Var10._M_head_impl)->value + lVar24) * 0.5;
          auVar27 = vfmadd213sd_fma(auVar28,auVar34,auVar27);
          *(double *)
           (*(long *)((long)local_78._M_head_impl + 0x68) +
           (long)*(int *)(uVar7 + lVar21 * 2 * 4) * 8) =
               auVar27._0_8_ +
               *(double *)
                (*(long *)((long)local_78._M_head_impl + 0x68) +
                (long)*(int *)(uVar7 + lVar21 * 2 * 4) * 8);
          this = (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
                  *)local_78;
          if ((int)(size_type)local_80 <= iVar16) break;
          lVar24 = lVar24 + 0x10;
          bVar8 = lVar22 < local_48;
          lVar22 = lVar19;
        } while (bVar8);
        _Var11._M_head_impl = *(bound_factor **)((long)local_78._M_head_impl + 0x58);
        if ((&(_Var11._M_head_impl)->min)[(long)local_68._M_head_impl] <= iVar16) goto LAB_00178cf7;
LAB_00178e33:
        uVar9 = (uint)lVar19;
        iVar13 = uVar9 + 1;
      }
      this = (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
              *)local_78._M_head_impl;
      if (iVar13 < iVar17) {
        rVar12 = local_78._M_head_impl[10];
        lVar19 = (long)(int)uVar9 << 4;
        iVar17 = ~uVar9 + iVar17;
        do {
          uVar7 = local_98._8_8_;
          lVar22 = (long)*(int *)((long)rVar12 + 0x18 + lVar19);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_98._8_8_ + (lVar22 * 2 + 1) * 4));
          rVar12 = *(row_value *)((long)this + 0x50);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = dVar25;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = delta;
          pdVar1 = (double *)((long)rVar12 + 0x10 + lVar19);
          lVar19 = lVar19 + 0x10;
          iVar17 = iVar17 + -1;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *pdVar1 * 0.5;
          auVar27 = vfmadd213sd_fma(auVar31,auVar38,auVar37);
          *(double *)
           ((long)*(row_value *)((long)this + 0x68) + (long)*(int *)(uVar7 + lVar22 * 2 * 4) * 8) =
               *(double *)
                ((long)*(row_value *)((long)this + 0x68) +
                (long)*(int *)(uVar7 + lVar22 * 2 * 4) * 8) - auVar27._0_8_;
        } while (iVar17 != 0);
      }
      bVar8 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>_>
                          *)this,(int)local_88._M_t.
                                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                      super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (!bVar8) {
LAB_00178ef2:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      first._M_current = local_50 + 1;
    } while (first._M_current != local_58);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }